

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutils.h
# Opt level: O0

int linsolve(int n,double *A,int stride,double *b,double *x)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double c;
  int k;
  int j;
  int i;
  double *x_local;
  double *b_local;
  int stride_local;
  double *A_local;
  int n_local;
  
  for (k = 0; k < n + -1; k = k + 1) {
    for (i = n + -1; k < i; i = i + -1) {
      if (ABS(A[(i + -1) * stride + k]) < ABS(A[i * stride + k])) {
        for (j = 0; j < n; j = j + 1) {
          dVar1 = A[i * stride + j];
          A[i * stride + j] = A[(i + -1) * stride + j];
          A[(i + -1) * stride + j] = dVar1;
        }
        dVar1 = b[i];
        b[i] = b[i + -1];
        b[i + -1] = dVar1;
      }
    }
    for (i = k; i < n + -1; i = i + 1) {
      if (ABS(A[k * stride + k]) < 1e-16) {
        return 0;
      }
      dVar1 = A[(i + 1) * stride + k];
      dVar2 = A[k * stride + k];
      for (j = 0; j < n; j = j + 1) {
        iVar3 = (i + 1) * stride + j;
        A[iVar3] = -(dVar1 / dVar2) * A[k * stride + j] + A[iVar3];
      }
      b[i + 1] = -(dVar1 / dVar2) * b[k] + b[i + 1];
    }
  }
  i = n + -1;
  while( true ) {
    if (i < 0) {
      return 1;
    }
    if (ABS(A[i * stride + i]) < 1e-16) break;
    c = 0.0;
    j = i;
    while (j = j + 1, j <= n + -1) {
      c = A[i * stride + j] * x[j] + c;
    }
    x[i] = (b[i] - c) / A[i * stride + i];
    i = i + -1;
  }
  return 0;
}

Assistant:

static inline int linsolve(int n, double *A, int stride, double *b, double *x) {
  int i, j, k;
  double c;
  // Forward elimination
  for (k = 0; k < n - 1; k++) {
    // Bring the largest magnitude to the diagonal position
    for (i = n - 1; i > k; i--) {
      if (fabs(A[(i - 1) * stride + k]) < fabs(A[i * stride + k])) {
        for (j = 0; j < n; j++) {
          c = A[i * stride + j];
          A[i * stride + j] = A[(i - 1) * stride + j];
          A[(i - 1) * stride + j] = c;
        }
        c = b[i];
        b[i] = b[i - 1];
        b[i - 1] = c;
      }
    }
    for (i = k; i < n - 1; i++) {
      if (fabs(A[k * stride + k]) < TINY_NEAR_ZERO) return 0;
      c = A[(i + 1) * stride + k] / A[k * stride + k];
      for (j = 0; j < n; j++) A[(i + 1) * stride + j] -= c * A[k * stride + j];
      b[i + 1] -= c * b[k];
    }
  }
  // Backward substitution
  for (i = n - 1; i >= 0; i--) {
    if (fabs(A[i * stride + i]) < TINY_NEAR_ZERO) return 0;
    c = 0;
    for (j = i + 1; j <= n - 1; j++) c += A[i * stride + j] * x[j];
    x[i] = (b[i] - c) / A[i * stride + i];
  }

  return 1;
}